

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O1

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_transformFeasibility
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  ulong uVar1;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *p_vector;
  double dVar2;
  Verbosity VVar3;
  RangeType RVar4;
  uint uVar5;
  pointer pnVar6;
  pointer pnVar7;
  SPxLPRational *pSVar8;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar9;
  pointer pnVar10;
  int iVar11;
  int iVar12;
  Verbosity old_verbosity;
  long lVar13;
  ulong uVar14;
  EVP_PKEY_CTX *ctx;
  long lVar15;
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  *pcVar16;
  Item *pIVar17;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *pNVar18;
  type t;
  Rational shiftValue;
  Rational shiftValue2;
  SPxColId id;
  data_type local_298;
  undefined8 local_288;
  undefined5 uStack_280;
  undefined3 uStack_27b;
  uint local_278;
  undefined1 uStack_274;
  undefined3 uStack_273;
  undefined5 local_270;
  undefined3 uStack_26b;
  undefined8 local_268;
  Item *local_250;
  data_type local_248;
  undefined8 local_238;
  undefined5 uStack_230;
  undefined3 uStack_22b;
  uint local_228;
  undefined1 uStack_224;
  undefined3 uStack_223;
  undefined5 local_220;
  undefined3 uStack_21b;
  undefined8 local_218;
  undefined **local_1a0;
  void *local_188;
  data_type local_168;
  undefined4 local_158;
  undefined2 local_154;
  char local_152;
  data_type local_148;
  undefined4 local_138;
  undefined2 local_134;
  char local_132;
  ulong local_120;
  data_type local_118;
  undefined4 local_108;
  undefined2 local_104;
  char local_102;
  data_type local_f8;
  undefined4 local_e8;
  undefined2 local_e4;
  char local_e2;
  data_type local_d8;
  undefined8 local_c8;
  undefined5 uStack_c0;
  undefined3 uStack_bb;
  uint local_b8;
  undefined1 uStack_b4;
  undefined3 uStack_b3;
  undefined5 local_b0;
  undefined3 uStack_ab;
  undefined8 local_a8;
  undefined8 local_98;
  ulong local_90;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_88;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  VVar3 = (this->spxout).m_verbosity;
  if (2 < (int)VVar3) {
    (this->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[3],"Setting up LP to test for feasibility.\n",0x27);
    (this->spxout).m_verbosity = VVar3;
  }
  (*this->_statistics->transformTime->_vptr_Timer[3])();
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim(&this->_feasObj,
          (this->_rationalLP->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          .set.thenum,true);
  lVar13 = (long)(this->_rationalLP->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 .set.thenum;
  if (0 < lVar13) {
    lVar15 = lVar13 + 1;
    lVar13 = lVar13 * 0x40 + -0x20;
    do {
      pnVar6 = (this->_rationalLP->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               ).object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar7 = (this->_feasObj).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)((long)pnVar7 + lVar13 + -0x20),
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)((long)pnVar6 + lVar13 + -0x20));
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)((long)&(pnVar7->m_backend).m_value.num.m_backend.
                          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                          .m_data + lVar13),
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)((long)&(pnVar6->m_backend).m_value.num.m_backend.
                          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                          .m_data + lVar13));
      lVar15 = lVar15 + -1;
      lVar13 = lVar13 + -0x40;
    } while (1 < lVar15);
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim(&this->_feasLower,
          (this->_rationalLP->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          .set.thenum,true);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim(&this->_feasUpper,
          (this->_rationalLP->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          .set.thenum,true);
  lVar13 = (long)(this->_rationalLP->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 .set.thenum;
  if (0 < lVar13) {
    lVar15 = lVar13 + 1;
    lVar13 = lVar13 * 0x40 + -0x20;
    do {
      RVar4 = (this->_colTypes).data[lVar15 + -2];
      if ((RVar4 < (RANGETYPE_FIXED|RANGETYPE_LOWER)) && ((0x1aU >> (RVar4 & 0x1f) & 1) != 0)) {
        pnVar6 = (this->_rationalLP->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 ).low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar7 = (this->_feasLower).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)pnVar7 + lVar13 + -0x20),
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)pnVar6 + lVar13 + -0x20));
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&(pnVar7->m_backend).m_value.num.m_backend.
                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                            .m_data + lVar13),
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&(pnVar6->m_backend).m_value.num.m_backend.
                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                            .m_data + lVar13));
      }
      if ((this->_colTypes).data[lVar15 + -2] - RANGETYPE_UPPER < 3) {
        pnVar6 = (this->_rationalLP->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 ).up.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar7 = (this->_feasUpper).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)pnVar7 + lVar13 + -0x20),
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)pnVar6 + lVar13 + -0x20));
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&(pnVar7->m_backend).m_value.num.m_backend.
                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                            .m_data + lVar13),
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&(pnVar6->m_backend).m_value.num.m_backend.
                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                            .m_data + lVar13));
      }
      lVar15 = lVar15 + -1;
      lVar13 = lVar13 + -0x40;
    } while (1 < lVar15);
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim(&this->_feasLhs,
          (this->_rationalLP->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          .set.thenum,true);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim(&this->_feasRhs,
          (this->_rationalLP->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          .set.thenum,true);
  lVar13 = (long)(this->_rationalLP->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 .set.thenum;
  if (0 < lVar13) {
    lVar15 = lVar13 + 1;
    lVar13 = lVar13 * 0x40 + -0x20;
    do {
      RVar4 = (this->_rowTypes).data[lVar15 + -2];
      if ((RVar4 < (RANGETYPE_FIXED|RANGETYPE_LOWER)) && ((0x1aU >> (RVar4 & 0x1f) & 1) != 0)) {
        pnVar6 = (this->_rationalLP->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 ).left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar7 = (this->_feasLhs).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)pnVar7 + lVar13 + -0x20),
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)pnVar6 + lVar13 + -0x20));
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&(pnVar7->m_backend).m_value.num.m_backend.
                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                            .m_data + lVar13),
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&(pnVar6->m_backend).m_value.num.m_backend.
                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                            .m_data + lVar13));
      }
      if ((this->_rowTypes).data[lVar15 + -2] - RANGETYPE_UPPER < 3) {
        pnVar6 = (this->_rationalLP->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 ).right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar7 = (this->_feasRhs).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)pnVar7 + lVar13 + -0x20),
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)pnVar6 + lVar13 + -0x20));
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&(pnVar7->m_backend).m_value.num.m_backend.
                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                            .m_data + lVar13),
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&(pnVar6->m_backend).m_value.num.m_backend.
                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                            .m_data + lVar13));
      }
      lVar15 = lVar15 + -1;
      lVar13 = lVar13 + -0x40;
    } while (1 < lVar15);
  }
  local_168.la[0] = 0;
  local_158 = 1;
  local_154 = 0x100;
  local_152 = '\0';
  local_148.la[0] = 1;
  local_138 = 1;
  local_134 = 0x100;
  local_132 = '\0';
  local_118.la[0] = 0;
  local_108 = 1;
  local_104 = 0x100;
  local_102 = '\0';
  local_f8.la[0] = 1;
  local_e8 = 1;
  local_e4 = 0x100;
  local_e2 = '\0';
  uVar14 = (ulong)(this->_rationalLP->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  .set.thenum;
  if (0 < (long)uVar14) {
    do {
      pSVar8 = this->_rationalLP;
      local_298.la[0] = 0;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::rational_adaptor<long_long>
                ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  *)&local_248.ld,(longlong *)local_298.la,(type *)0x0);
      uVar1 = uVar14 - 1;
      (*(pSVar8->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
        ._vptr_ClassArray[0x27])(pSVar8,uVar1 & 0xffffffff,&local_248,0);
      if ((local_218._5_1_ == '\0') && (local_218._6_1_ == '\0')) {
        operator_delete((void *)CONCAT35(uStack_21b,local_220),(ulong)local_228 << 3);
      }
      if ((local_238._5_1_ == '\0') && (local_238._6_1_ == '\0')) {
        operator_delete(local_248.ld.data,(local_248.la[0] & 0xffffffff) << 3);
      }
      pSVar9 = this->_realLP;
      local_218 = 0xa00000000;
      local_248.la[0] = 0;
      local_248.ld.data = (limb_pointer)0x0;
      local_238 = 0;
      uStack_230 = 0;
      uStack_22b = 0;
      local_228 = 0;
      uStack_224 = 0;
      uStack_223 = 0;
      local_220 = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_248.ld,0.0);
      (*(pSVar9->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x27])(pSVar9,uVar1 & 0xffffffff,&local_248,0);
      pnVar6 = (this->_rationalLP->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_298.la[0] = 0;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::rational_adaptor<long_long>
                ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  *)&local_248.ld,(longlong *)local_298.la,(type *)0x0);
      iVar12 = boost::multiprecision::backends::
               rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
               ::compare(&pnVar6[uVar1].m_backend,
                         (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)&local_248.ld);
      if ((local_218._5_1_ == '\0') && (local_218._6_1_ == '\0')) {
        operator_delete((void *)CONCAT35(uStack_21b,local_220),(ulong)local_228 << 3);
      }
      if ((local_238._5_1_ == '\0') && (local_238._6_1_ == '\0')) {
        operator_delete(local_248.ld.data,(local_248.la[0] & 0xffffffff) << 3);
      }
      pSVar8 = this->_rationalLP;
      local_90 = uVar14;
      if (iVar12 < 1) {
        pnVar6 = (pSVar8->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 ).up.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_298.la[0] = 0;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&local_248.ld,(longlong *)local_298.la,(type *)0x0);
        iVar12 = boost::multiprecision::backends::
                 rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 ::compare(&pnVar6[uVar1].m_backend,
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_248.ld);
        if ((local_218._5_1_ == '\0') && (local_218._6_1_ == '\0')) {
          operator_delete((void *)CONCAT35(uStack_21b,local_220),(ulong)local_228 << 3);
        }
        if ((local_238._5_1_ == '\0') && (local_238._6_1_ == '\0')) {
          operator_delete(local_248.ld.data,(local_248.la[0] & 0xffffffff) << 3);
        }
        if (iVar12 < 0) {
          pIVar17 = (this->_rationalLP->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    .set.theitem;
          iVar12 = (this->_rationalLP->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   .set.thekey[uVar1].idx;
          local_120 = uVar1;
          if (0 < pIVar17[iVar12].data.
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  .memused) {
            local_250 = pIVar17 + iVar12;
            lVar15 = 0;
            lVar13 = 0;
            do {
              pNVar18 = (local_250->data).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        .m_elem;
              boost::multiprecision::backends::
              cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_168.ld,
                       (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)((long)&(pNVar18->val).m_backend.m_value.num.m_backend.
                                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                  .m_data + lVar15));
              boost::multiprecision::backends::
              cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_148.ld,
                       (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)((long)&(pNVar18->val).m_backend.m_value.den.m_backend.
                                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                  .m_data + lVar15));
              boost::
              rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::operator*=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                            *)&local_168.ld,
                           (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                            *)((this->_rationalLP->
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                               ).up.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar1));
              uVar5 = *(uint *)((long)&((local_250->data).
                                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                       .m_elem)->idx + lVar15);
              RVar4 = (this->_rowTypes).data[(int)uVar5];
              if ((RVar4 < (RANGETYPE_FIXED|RANGETYPE_LOWER)) &&
                 ((0x1aU >> (RVar4 & 0x1f) & 1) != 0)) {
                if (RVar4 - RANGETYPE_UPPER < 3) {
                  pcVar16 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                             *)((this->_rationalLP->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                ).left.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + (int)uVar5);
                  boost::multiprecision::backends::
                  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                            *)&local_118.ld,pcVar16);
                  boost::multiprecision::backends::
                  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                            *)&local_f8.ld,pcVar16 + 1);
                  boost::
                  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ::operator-=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                                *)&local_118.ld,
                               (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                                *)&local_168.ld);
                  (*(this->_rationalLP->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    .
                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                    ._vptr_ClassArray[0x33])(this->_rationalLP,(ulong)uVar5,&local_118);
                  pSVar9 = this->_realLP;
                  local_218 = 0xa00000000;
                  local_248.la[0] = 0;
                  local_248.ld.data = (limb_pointer)0x0;
                  local_238 = 0;
                  uStack_230 = 0;
                  uStack_22b = 0;
                  local_228 = 0;
                  uStack_224 = 0;
                  uStack_223 = 0;
                  local_220 = 0;
                  boost::multiprecision::detail::
                  generic_convert_rational_to_float<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                            ((cpp_dec_float<50U,_int,_void> *)&local_248.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_118.ld);
                  (*(pSVar9->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._vptr_ClassArray[0x33])(pSVar9,(ulong)uVar5,&local_248);
                  boost::
                  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ::operator-=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                                *)&local_168.ld,
                               (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                                *)((this->_rationalLP->
                                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                   ).right.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + (int)uVar5));
                  local_248.ld.capacity = 0xffffffff;
                  boost::multiprecision::
                  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                  ::operator*=((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                                *)&local_168.ld,(int *)local_248.la);
                  (*(this->_rationalLP->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    .
                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                    ._vptr_ClassArray[0x36])(this->_rationalLP,(ulong)uVar5,&local_168);
                  pSVar9 = this->_realLP;
                  local_218 = 0xa00000000;
                  local_248.la[0] = 0;
                  local_248.ld.data = (limb_pointer)0x0;
                  local_238 = 0;
                  uStack_230 = 0;
                  uStack_22b = 0;
                  local_228 = 0;
                  uStack_224 = 0;
                  uStack_223 = 0;
                  local_220 = 0;
                  boost::multiprecision::detail::
                  generic_convert_rational_to_float<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                            ((cpp_dec_float<50U,_int,_void> *)&local_248.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_168.ld);
                  (*(pSVar9->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._vptr_ClassArray[0x36])(pSVar9,(ulong)uVar5,&local_248);
                }
                else {
                  if ((RANGETYPE_FIXED < RVar4) || ((0x1aU >> (RVar4 & 0x1f) & 1) == 0))
                  goto LAB_00363d43;
                  boost::
                  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ::operator-=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                                *)&local_168.ld,
                               (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                                *)((this->_rationalLP->
                                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                   ).left.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + (int)uVar5));
                  local_248.ld.capacity = 0xffffffff;
                  boost::multiprecision::
                  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                  ::operator*=((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                                *)&local_168.ld,(int *)local_248.la);
                  (*(this->_rationalLP->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    .
                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                    ._vptr_ClassArray[0x33])(this->_rationalLP,(ulong)uVar5,&local_168);
                  pSVar9 = this->_realLP;
                  local_218 = 0xa00000000;
                  local_248.la[0] = 0;
                  local_248.ld.data = (limb_pointer)0x0;
                  local_238 = 0;
                  uStack_230 = 0;
                  uStack_22b = 0;
                  local_228 = 0;
                  uStack_224 = 0;
                  uStack_223 = 0;
                  local_220 = 0;
                  boost::multiprecision::detail::
                  generic_convert_rational_to_float<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                            ((cpp_dec_float<50U,_int,_void> *)&local_248.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_168.ld);
                  (*(pSVar9->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._vptr_ClassArray[0x33])(pSVar9,(ulong)uVar5,&local_248);
                }
              }
              else {
LAB_00363d43:
                if (RVar4 - RANGETYPE_UPPER < 3) {
                  boost::
                  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ::operator-=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                                *)&local_168.ld,
                               (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                                *)((this->_rationalLP->
                                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                   ).right.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + (int)uVar5));
                  local_248.ld.capacity = 0xffffffff;
                  boost::multiprecision::
                  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                  ::operator*=((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                                *)&local_168.ld,(int *)local_248.la);
                  (*(this->_rationalLP->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    .
                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                    ._vptr_ClassArray[0x36])(this->_rationalLP,(ulong)uVar5,&local_168);
                  pSVar9 = this->_realLP;
                  local_218 = 0xa00000000;
                  local_248.la[0] = 0;
                  local_248.ld.data = (limb_pointer)0x0;
                  local_238 = 0;
                  uStack_230 = 0;
                  uStack_22b = 0;
                  local_228 = 0;
                  uStack_224 = 0;
                  uStack_223 = 0;
                  local_220 = 0;
                  boost::multiprecision::detail::
                  generic_convert_rational_to_float<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                            ((cpp_dec_float<50U,_int,_void> *)&local_248.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_168.ld);
                  (*(pSVar9->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._vptr_ClassArray[0x36])(pSVar9,(ulong)uVar5,&local_248);
                }
              }
              lVar13 = lVar13 + 1;
              lVar15 = lVar15 + 0x50;
            } while (lVar13 < (local_250->data).
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                              .memused);
          }
          uVar14 = local_120;
          RVar4 = (this->_colTypes).data[local_120];
          if ((RVar4 < (RANGETYPE_FIXED|RANGETYPE_LOWER)) && ((0x1aU >> (RVar4 & 0x1f) & 1) != 0)) {
            pSVar8 = this->_rationalLP;
            local_d8.la[0] =
                 (limb_type)
                 ((pSVar8->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ).low.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar1);
            local_d8.ld.data =
                 (limb_pointer)
                 ((pSVar8->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ).up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar1);
            boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
            ::
            number<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>
                      ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                        *)&local_248.ld,
                       (expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                        *)&local_d8.ld,(type *)0x0);
            local_68.m_backend.data._M_elems[0] = 0;
            local_68.m_backend.data._M_elems[1] = 0;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor<long_long>
                      ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)&local_298.ld,(longlong *)&local_68,(type *)0x0);
            (*(pSVar8->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
              ._vptr_ClassArray[0x30])(pSVar8,uVar14 & 0xffffffff,&local_248,&local_298);
            if ((local_268._5_1_ == '\0') && (local_268._6_1_ == '\0')) {
              operator_delete((void *)CONCAT35(uStack_26b,local_270),(ulong)local_278 << 3);
            }
            if ((local_288._5_1_ == '\0') && (local_288._6_1_ == '\0')) {
              operator_delete(local_298.ld.data,(local_298.la[0] & 0xffffffff) << 3);
            }
            if ((local_218._5_1_ == '\0') && (local_218._6_1_ == '\0')) {
              operator_delete((void *)CONCAT35(uStack_21b,local_220),(ulong)local_228 << 3);
            }
            if ((local_238._5_1_ == '\0') && (local_238._6_1_ == '\0')) {
              operator_delete(local_248.ld.data,(local_248.la[0] & 0xffffffff) << 3);
            }
            pSVar9 = this->_realLP;
            local_218 = 0xa00000000;
            local_248.la[0] = 0;
            local_248.ld.data = (limb_pointer)0x0;
            local_238 = 0;
            uStack_230 = 0;
            uStack_22b = 0;
            local_228 = 0;
            uStack_224 = 0;
            uStack_223 = 0;
            local_220 = 0;
            boost::multiprecision::detail::
            generic_convert_rational_to_float<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                      ((cpp_dec_float<50U,_int,_void> *)&local_248.ld,
                       &(this->_rationalLP->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        ).low.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar1].m_backend);
            local_268 = 0xa00000000;
            local_298.la[0] = 0;
            local_298.ld.data = (limb_pointer)0x0;
            local_288 = 0;
            uStack_280 = 0;
            uStack_27b = 0;
            local_278 = 0;
            uStack_274 = 0;
            uStack_273 = 0;
            local_270 = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_298.ld,0.0);
            (*(pSVar9->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x30])(pSVar9,uVar14 & 0xffffffff,&local_248);
          }
          else {
            pnVar10 = (this->_realLP->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((pnVar10[local_120].m_backend.fpclass != cpp_dec_float_NaN) &&
               (dVar2 = this->_currentSettings->_realParamValues[6], !NAN(dVar2))) {
              local_218 = 0xa00000000;
              local_248.la[0] = 0;
              local_248.ld.data = (limb_pointer)0x0;
              local_238 = 0;
              uStack_230 = 0;
              uStack_22b = 0;
              local_228 = 0;
              uStack_224 = 0;
              uStack_223 = 0;
              local_220 = 0;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_248.ld,-dVar2);
              iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&pnVar10[uVar14].m_backend,
                                  (cpp_dec_float<50U,_int,_void> *)&local_248.ld);
              if (0 < iVar12) {
                pSVar8 = this->_rationalLP;
                local_298.la[0] = 0;
                boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                ::rational_adaptor<long_long>
                          ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_248.ld,(longlong *)local_298.la,(type *)0x0);
                (*(pSVar8->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                  ._vptr_ClassArray[0x2d])(pSVar8,uVar14 & 0xffffffff,&local_248,0);
                if ((local_218._5_1_ == '\0') && (local_218._6_1_ == '\0')) {
                  operator_delete((void *)CONCAT35(uStack_21b,local_220),(ulong)local_228 << 3);
                }
                if ((local_238._5_1_ == '\0') && (local_238._6_1_ == '\0')) {
                  operator_delete(local_248.ld.data,(local_248.la[0] & 0xffffffff) << 3);
                }
                pSVar9 = this->_realLP;
                local_218 = 0xa00000000;
                local_248.la[0] = 0;
                local_248.ld.data = (limb_pointer)0x0;
                local_238 = 0;
                uStack_230 = 0;
                uStack_22b = 0;
                local_228 = 0;
                uStack_224 = 0;
                uStack_223 = 0;
                local_220 = 0;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)&local_248.ld,
                           -this->_currentSettings->_realParamValues[6]);
                local_268 = 0xa00000000;
                local_298.la[0] = 0;
                local_298.ld.data = (limb_pointer)0x0;
                local_288 = 0;
                uStack_280 = 0;
                uStack_27b = 0;
                local_278 = 0;
                uStack_274 = 0;
                uStack_273 = 0;
                local_270 = 0;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)&local_298.ld,0.0);
                (*(pSVar9->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._vptr_ClassArray[0x30])(pSVar9,uVar14 & 0xffffffff,&local_248,&local_298,0);
                goto LAB_003644d4;
              }
            }
            pSVar8 = this->_rationalLP;
            local_298.la[0] = 0;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor<long_long>
                      ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)&local_248.ld,(longlong *)local_298.la,(type *)0x0);
            (*(pSVar8->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
              ._vptr_ClassArray[0x2d])(pSVar8,uVar14 & 0xffffffff,&local_248);
            if ((local_218._5_1_ == '\0') && (local_218._6_1_ == '\0')) {
              operator_delete((void *)CONCAT35(uStack_21b,local_220),(ulong)local_228 << 3);
            }
            if ((local_238._5_1_ == '\0') && (local_238._6_1_ == '\0')) {
              operator_delete(local_248.ld.data,(local_248.la[0] & 0xffffffff) << 3);
            }
            pSVar9 = this->_realLP;
            local_218 = 0xa00000000;
            local_248.la[0] = 0;
            local_248.ld.data = (limb_pointer)0x0;
            local_238 = 0;
            uStack_230 = 0;
            uStack_22b = 0;
            local_228 = 0;
            uStack_224 = 0;
            uStack_223 = 0;
            local_220 = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_248.ld,0.0);
            (*(pSVar9->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x2d])(pSVar9,uVar14 & 0xffffffff,&local_248);
          }
        }
        else {
          RVar4 = (this->_colTypes).data[uVar1];
          if ((RVar4 < (RANGETYPE_FIXED|RANGETYPE_LOWER)) && ((0x1aU >> (RVar4 & 0x1f) & 1) != 0)) {
            pSVar9 = this->_realLP;
            local_218 = 0xa00000000;
            local_248.la[0] = 0;
            local_248.ld.data = (limb_pointer)0x0;
            local_238 = 0;
            uStack_230 = 0;
            uStack_22b = 0;
            local_228 = 0;
            uStack_224 = 0;
            uStack_223 = 0;
            local_220 = 0;
            boost::multiprecision::detail::
            generic_convert_rational_to_float<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                      ((cpp_dec_float<50U,_int,_void> *)&local_248.ld,
                       &(this->_rationalLP->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        ).low.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar1].m_backend);
            (*(pSVar9->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x2a])(pSVar9,uVar1 & 0xffffffff,&local_248);
          }
          else {
            pnVar10 = (this->_realLP->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((pnVar10[uVar1].m_backend.fpclass != cpp_dec_float_NaN) &&
               (dVar2 = this->_currentSettings->_realParamValues[6], !NAN(dVar2))) {
              local_218 = 0xa00000000;
              local_248.la[0] = 0;
              local_248.ld.data = (limb_pointer)0x0;
              local_238 = 0;
              uStack_230 = 0;
              uStack_22b = 0;
              local_228 = 0;
              uStack_224 = 0;
              uStack_223 = 0;
              local_220 = 0;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_248.ld,-dVar2);
              iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&pnVar10[uVar1].m_backend,
                                  (cpp_dec_float<50U,_int,_void> *)&local_248.ld);
              if (0 < iVar12) {
                pSVar9 = this->_realLP;
                local_218 = 0xa00000000;
                local_248.la[0] = 0;
                local_248.ld.data = (limb_pointer)0x0;
                local_238 = 0;
                uStack_230 = 0;
                uStack_22b = 0;
                local_228 = 0;
                uStack_224 = 0;
                uStack_223 = 0;
                local_220 = 0;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)&local_248.ld,
                           -this->_currentSettings->_realParamValues[6]);
                (*(pSVar9->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._vptr_ClassArray[0x2a])(pSVar9,uVar1 & 0xffffffff,&local_248);
              }
            }
          }
          pSVar9 = this->_realLP;
          uVar14 = uVar1;
          if ((this->_colTypes).data[uVar1] - RANGETYPE_UPPER < 3) {
            local_218 = 0xa00000000;
            local_248.la[0] = 0;
            local_248.ld.data = (limb_pointer)0x0;
            local_238 = 0;
            uStack_230 = 0;
            uStack_22b = 0;
            local_228 = 0;
            uStack_224 = 0;
            uStack_223 = 0;
            local_220 = 0;
            boost::multiprecision::detail::
            generic_convert_rational_to_float<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                      ((cpp_dec_float<50U,_int,_void> *)&local_248.ld,
                       &(this->_rationalLP->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        ).up.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar1].m_backend);
            (*(pSVar9->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x2d])(pSVar9,uVar1 & 0xffffffff,&local_248);
          }
          else {
            pnVar10 = (pSVar9->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((pnVar10[uVar1].m_backend.fpclass != cpp_dec_float_NaN) &&
               (dVar2 = this->_currentSettings->_realParamValues[6], !NAN(dVar2))) {
              local_218 = 0xa00000000;
              local_248.la[0] = 0;
              local_248.ld.data = (limb_pointer)0x0;
              local_238 = 0;
              uStack_230 = 0;
              uStack_22b = 0;
              local_228 = 0;
              uStack_224 = 0;
              uStack_223 = 0;
              local_220 = 0;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_248.ld,dVar2);
              iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&pnVar10[uVar1].m_backend,
                                  (cpp_dec_float<50U,_int,_void> *)&local_248.ld);
              if (iVar12 < 0) {
                pSVar9 = this->_realLP;
                local_218 = 0xa00000000;
                local_248.la[0] = 0;
                local_248.ld.data = (limb_pointer)0x0;
                local_238 = 0;
                uStack_230 = 0;
                uStack_22b = 0;
                local_228 = 0;
                uStack_224 = 0;
                uStack_223 = 0;
                local_220 = 0;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)&local_248.ld,
                           this->_currentSettings->_realParamValues[6]);
                (*(pSVar9->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._vptr_ClassArray[0x2d])(pSVar9,uVar1 & 0xffffffff,&local_248);
              }
            }
          }
        }
      }
      else {
        pIVar17 = (pSVar8->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  .set.theitem;
        iVar12 = (pSVar8->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 .set.thekey[uVar1].idx;
        local_120 = uVar1;
        if (0 < pIVar17[iVar12].data.
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                .memused) {
          local_250 = pIVar17 + iVar12;
          lVar15 = 0;
          lVar13 = 0;
          do {
            pNVar18 = (local_250->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      .m_elem;
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_168.ld,
                     (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)((long)&(pNVar18->val).m_backend.m_value.num.m_backend.
                                super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                .m_data + lVar15));
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_148.ld,
                     (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)((long)&(pNVar18->val).m_backend.m_value.den.m_backend.
                                super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                .m_data + lVar15));
            boost::
            rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
            ::operator*=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                          *)&local_168.ld,
                         (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                          *)((this->_rationalLP->
                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                             ).low.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar1));
            uVar5 = *(uint *)((long)&((local_250->data).
                                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                     .m_elem)->idx + lVar15);
            RVar4 = (this->_rowTypes).data[(int)uVar5];
            if ((RVar4 < (RANGETYPE_FIXED|RANGETYPE_LOWER)) && ((0x1aU >> (RVar4 & 0x1f) & 1) != 0))
            {
              if (RVar4 - RANGETYPE_UPPER < 3) {
                pcVar16 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                           *)((this->_rationalLP->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                              ).left.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + (int)uVar5);
                boost::multiprecision::backends::
                cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                          *)&local_118.ld,pcVar16);
                boost::multiprecision::backends::
                cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                          *)&local_f8.ld,pcVar16 + 1);
                boost::
                rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                ::operator-=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                              *)&local_118.ld,
                             (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                              *)&local_168.ld);
                (*(this->_rationalLP->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                  ._vptr_ClassArray[0x33])(this->_rationalLP,(ulong)uVar5,&local_118);
                pSVar9 = this->_realLP;
                local_218 = 0xa00000000;
                local_248.la[0] = 0;
                local_248.ld.data = (limb_pointer)0x0;
                local_238 = 0;
                uStack_230 = 0;
                uStack_22b = 0;
                local_228 = 0;
                uStack_224 = 0;
                uStack_223 = 0;
                local_220 = 0;
                boost::multiprecision::detail::
                generic_convert_rational_to_float<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                          ((cpp_dec_float<50U,_int,_void> *)&local_248.ld,
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_118.ld);
                (*(pSVar9->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._vptr_ClassArray[0x33])(pSVar9,(ulong)uVar5,&local_248);
                boost::
                rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                ::operator-=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                              *)&local_168.ld,
                             (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                              *)((this->_rationalLP->
                                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                 ).right.val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + (int)uVar5));
                local_248.ld.capacity = 0xffffffff;
                boost::multiprecision::
                number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                ::operator*=((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                              *)&local_168.ld,(int *)local_248.la);
                (*(this->_rationalLP->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                  ._vptr_ClassArray[0x36])(this->_rationalLP,(ulong)uVar5,&local_168);
                pSVar9 = this->_realLP;
                local_218 = 0xa00000000;
                local_248.la[0] = 0;
                local_248.ld.data = (limb_pointer)0x0;
                local_238 = 0;
                uStack_230 = 0;
                uStack_22b = 0;
                local_228 = 0;
                uStack_224 = 0;
                uStack_223 = 0;
                local_220 = 0;
                boost::multiprecision::detail::
                generic_convert_rational_to_float<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                          ((cpp_dec_float<50U,_int,_void> *)&local_248.ld,
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_168.ld);
                (*(pSVar9->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._vptr_ClassArray[0x36])(pSVar9,(ulong)uVar5,&local_248);
              }
              else {
                if ((RANGETYPE_FIXED < RVar4) || ((0x1aU >> (RVar4 & 0x1f) & 1) == 0))
                goto LAB_003634d4;
                boost::
                rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                ::operator-=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                              *)&local_168.ld,
                             (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                              *)((this->_rationalLP->
                                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                 ).left.val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + (int)uVar5));
                local_248.ld.capacity = 0xffffffff;
                boost::multiprecision::
                number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                ::operator*=((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                              *)&local_168.ld,(int *)local_248.la);
                (*(this->_rationalLP->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                  ._vptr_ClassArray[0x33])(this->_rationalLP,(ulong)uVar5,&local_168);
                pSVar9 = this->_realLP;
                local_218 = 0xa00000000;
                local_248.la[0] = 0;
                local_248.ld.data = (limb_pointer)0x0;
                local_238 = 0;
                uStack_230 = 0;
                uStack_22b = 0;
                local_228 = 0;
                uStack_224 = 0;
                uStack_223 = 0;
                local_220 = 0;
                boost::multiprecision::detail::
                generic_convert_rational_to_float<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                          ((cpp_dec_float<50U,_int,_void> *)&local_248.ld,
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_168.ld);
                (*(pSVar9->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._vptr_ClassArray[0x33])(pSVar9,(ulong)uVar5,&local_248);
              }
            }
            else {
LAB_003634d4:
              if (RVar4 - RANGETYPE_UPPER < 3) {
                boost::
                rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                ::operator-=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                              *)&local_168.ld,
                             (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                              *)((this->_rationalLP->
                                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                 ).right.val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + (int)uVar5));
                local_248.ld.capacity = 0xffffffff;
                boost::multiprecision::
                number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                ::operator*=((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                              *)&local_168.ld,(int *)local_248.la);
                (*(this->_rationalLP->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                  ._vptr_ClassArray[0x36])(this->_rationalLP,(ulong)uVar5,&local_168);
                pSVar9 = this->_realLP;
                local_218 = 0xa00000000;
                local_248.la[0] = 0;
                local_248.ld.data = (limb_pointer)0x0;
                local_238 = 0;
                uStack_230 = 0;
                uStack_22b = 0;
                local_228 = 0;
                uStack_224 = 0;
                uStack_223 = 0;
                local_220 = 0;
                boost::multiprecision::detail::
                generic_convert_rational_to_float<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                          ((cpp_dec_float<50U,_int,_void> *)&local_248.ld,
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_168.ld);
                (*(pSVar9->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._vptr_ClassArray[0x36])(pSVar9,(ulong)uVar5,&local_248);
              }
            }
            lVar13 = lVar13 + 1;
            lVar15 = lVar15 + 0x50;
          } while (lVar13 < (local_250->data).
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            .memused);
        }
        uVar14 = local_120;
        if ((this->_colTypes).data[local_120] - RANGETYPE_UPPER < 3) {
          pSVar8 = this->_rationalLP;
          local_298.la[0] = 0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&local_248.ld,(longlong *)local_298.la,(type *)0x0);
          local_d8.la[0] =
               (limb_type)
               ((this->_rationalLP->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                ).up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar1);
          local_d8.ld.data =
               (limb_pointer)
               ((this->_rationalLP->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                ).low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar1);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
          ::
          number<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>
                    ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                      *)&local_298.ld,
                     (expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                      *)&local_d8.ld,(type *)0x0);
          (*(pSVar8->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
            ._vptr_ClassArray[0x30])(pSVar8,uVar14 & 0xffffffff,&local_248,&local_298);
          if ((local_268._5_1_ == '\0') && (local_268._6_1_ == '\0')) {
            operator_delete((void *)CONCAT35(uStack_26b,local_270),(ulong)local_278 << 3);
          }
          if ((local_288._5_1_ == '\0') && (local_288._6_1_ == '\0')) {
            operator_delete(local_298.ld.data,(local_298.la[0] & 0xffffffff) << 3);
          }
          if ((local_218._5_1_ == '\0') && (local_218._6_1_ == '\0')) {
            operator_delete((void *)CONCAT35(uStack_21b,local_220),(ulong)local_228 << 3);
          }
          if ((local_238._5_1_ == '\0') && (local_238._6_1_ == '\0')) {
            operator_delete(local_248.ld.data,(local_248.la[0] & 0xffffffff) << 3);
          }
          pSVar9 = this->_realLP;
          local_218 = 0xa00000000;
          local_248.la[0] = 0;
          local_248.ld.data = (limb_pointer)0x0;
          local_238 = 0;
          uStack_230 = 0;
          uStack_22b = 0;
          local_228 = 0;
          uStack_224 = 0;
          uStack_223 = 0;
          local_220 = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_248.ld,0.0);
          local_268 = 0xa00000000;
          local_298.la[0] = 0;
          local_298.ld.data = (limb_pointer)0x0;
          local_288 = 0;
          uStack_280 = 0;
          uStack_27b = 0;
          local_278 = 0;
          uStack_274 = 0;
          uStack_273 = 0;
          local_270 = 0;
          boost::multiprecision::detail::
          generic_convert_rational_to_float<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                    ((cpp_dec_float<50U,_int,_void> *)&local_298.ld,
                     &(this->_rationalLP->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar1].m_backend);
          (*(pSVar9->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x30])(pSVar9,uVar14 & 0xffffffff,&local_248);
        }
        else {
          pnVar10 = (this->_realLP->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((pnVar10[local_120].m_backend.fpclass != cpp_dec_float_NaN) &&
             (dVar2 = this->_currentSettings->_realParamValues[6], !NAN(dVar2))) {
            local_218 = 0xa00000000;
            local_248.la[0] = 0;
            local_248.ld.data = (limb_pointer)0x0;
            local_238 = 0;
            uStack_230 = 0;
            uStack_22b = 0;
            local_228 = 0;
            uStack_224 = 0;
            uStack_223 = 0;
            local_220 = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_248.ld,dVar2);
            iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&pnVar10[uVar14].m_backend,
                                (cpp_dec_float<50U,_int,_void> *)&local_248.ld);
            if (iVar12 < 0) {
              pSVar8 = this->_rationalLP;
              local_298.la[0] = 0;
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::rational_adaptor<long_long>
                        ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)&local_248.ld,(longlong *)local_298.la,(type *)0x0);
              (*(pSVar8->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                ._vptr_ClassArray[0x2a])(pSVar8,uVar14 & 0xffffffff,&local_248,0);
              if ((local_218._5_1_ == '\0') && (local_218._6_1_ == '\0')) {
                operator_delete((void *)CONCAT35(uStack_21b,local_220),(ulong)local_228 << 3);
              }
              if ((local_238._5_1_ == '\0') && (local_238._6_1_ == '\0')) {
                operator_delete(local_248.ld.data,(local_248.la[0] & 0xffffffff) << 3);
              }
              pSVar9 = this->_realLP;
              local_218 = 0xa00000000;
              local_248.la[0] = 0;
              local_248.ld.data = (limb_pointer)0x0;
              local_238 = 0;
              uStack_230 = 0;
              uStack_22b = 0;
              local_228 = 0;
              uStack_224 = 0;
              uStack_223 = 0;
              local_220 = 0;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_248.ld,0.0);
              local_268 = 0xa00000000;
              local_298.la[0] = 0;
              local_298.ld.data = (limb_pointer)0x0;
              local_288 = 0;
              uStack_280 = 0;
              uStack_27b = 0;
              local_278 = 0;
              uStack_274 = 0;
              uStack_273 = 0;
              local_270 = 0;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_298.ld,
                         this->_currentSettings->_realParamValues[6]);
              (*(pSVar9->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x30])(pSVar9,uVar14 & 0xffffffff,&local_248);
              goto LAB_003644d4;
            }
          }
          pSVar8 = this->_rationalLP;
          local_298.la[0] = 0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&local_248.ld,(longlong *)local_298.la,(type *)0x0);
          (*(pSVar8->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
            ._vptr_ClassArray[0x2a])(pSVar8,uVar14 & 0xffffffff,&local_248);
          if ((local_218._5_1_ == '\0') && (local_218._6_1_ == '\0')) {
            operator_delete((void *)CONCAT35(uStack_21b,local_220),(ulong)local_228 << 3);
          }
          if ((local_238._5_1_ == '\0') && (local_238._6_1_ == '\0')) {
            operator_delete(local_248.ld.data,(local_248.la[0] & 0xffffffff) << 3);
          }
          pSVar9 = this->_realLP;
          local_218 = 0xa00000000;
          local_248.la[0] = 0;
          local_248.ld.data = (limb_pointer)0x0;
          local_238 = 0;
          uStack_230 = 0;
          uStack_22b = 0;
          local_228 = 0;
          uStack_224 = 0;
          uStack_223 = 0;
          local_220 = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_248.ld,0.0);
          (*(pSVar9->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x2a])(pSVar9,uVar14 & 0xffffffff,&local_248);
        }
      }
LAB_003644d4:
    } while (1 < (long)local_90);
  }
  (this->_tauColVector).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  .memused = 0;
  lVar13 = (long)(this->_rationalLP->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 .set.thenum;
  if (0 < lVar13) {
    lVar15 = lVar13 + 1;
    pIVar17 = (Item *)(lVar13 * 0x38);
    lVar13 = lVar13 << 6;
    do {
      pIVar17 = (Item *)&pIVar17[-2].data.theprev;
      pnVar6 = (this->_rationalLP->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_298.la[0] = 0;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::rational_adaptor<long_long>
                ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  *)&local_248.ld,(longlong *)local_298.la,(type *)0x0);
      iVar12 = boost::multiprecision::backends::
               rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
               ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)((long)&pnVar6[-1].m_backend.m_value.num.m_backend.
                                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                    .m_data + lVar13),
                         (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)&local_248.ld);
      if ((local_218._5_1_ == '\0') && (local_218._6_1_ == '\0')) {
        operator_delete((void *)CONCAT35(uStack_21b,local_220),(ulong)local_228 << 3);
      }
      if ((local_238._5_1_ == '\0') && (local_238._6_1_ == '\0')) {
        operator_delete(local_248.ld.data,(local_248.la[0] & 0xffffffff) << 3);
      }
      iVar11 = (int)lVar15;
      if (iVar12 < 1) {
        pnVar6 = (this->_rationalLP->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 ).right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_298.la[0] = 0;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&local_248.ld,(longlong *)local_298.la,(type *)0x0);
        iVar12 = boost::multiprecision::backends::
                 rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)((long)&pnVar6[-1].m_backend.m_value.num.m_backend.
                                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                      .m_data + lVar13),
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_248.ld);
        if ((local_218._5_1_ == '\0') && (local_218._6_1_ == '\0')) {
          operator_delete((void *)CONCAT35(uStack_21b,local_220),(ulong)local_228 << 3);
        }
        if ((local_238._5_1_ == '\0') && (local_238._6_1_ == '\0')) {
          operator_delete(local_248.ld.data,(local_248.la[0] & 0xffffffff) << 3);
        }
        if (iVar12 < 0) {
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::add(&this->_tauColVector,iVar11 + -2,
                (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                 *)((long)&(this->_rationalLP->
                           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                           ).right.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.m_value.num.
                           m_backend.
                           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                           .m_data + lVar13));
          RVar4 = (this->_rowTypes).data[lVar15 + -2];
          if ((RVar4 < (RANGETYPE_FIXED|RANGETYPE_LOWER)) && ((0x1aU >> (RVar4 & 0x1f) & 1) != 0)) {
            pSVar8 = this->_rationalLP;
            local_d8.la[0] =
                 (long)&(pSVar8->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        ).left.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.m_value.num.
                        m_backend.
                        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        .m_data + lVar13;
            local_d8.ld.data =
                 (limb_pointer)
                 ((long)&(pSVar8->
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                         ).right.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.m_value.num.
                         m_backend.
                         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                         .m_data + lVar13);
            boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
            ::
            number<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>
                      ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                        *)&local_248.ld,
                       (expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                        *)&local_d8.ld,(type *)0x0);
            local_68.m_backend.data._M_elems[0] = 0;
            local_68.m_backend.data._M_elems[1] = 0;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor<long_long>
                      ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)&local_298.ld,(longlong *)&local_68,(type *)0x0);
            (*(pSVar8->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
              ._vptr_ClassArray[0x39])(pSVar8,(ulong)(iVar11 - 2),&local_248,&local_298,0);
            if ((local_268._5_1_ == '\0') && (local_268._6_1_ == '\0')) {
              operator_delete((void *)CONCAT35(uStack_26b,local_270),(ulong)local_278 << 3);
            }
            if ((local_288._5_1_ == '\0') && (local_288._6_1_ == '\0')) {
              operator_delete(local_298.ld.data,(local_298.la[0] & 0xffffffff) << 3);
            }
            if ((local_218._5_1_ == '\0') && (local_218._6_1_ == '\0')) {
              operator_delete((void *)CONCAT35(uStack_21b,local_220),(ulong)local_228 << 3);
            }
            if ((local_238._5_1_ == '\0') && (local_238._6_1_ == '\0')) {
              operator_delete(local_248.ld.data,(local_248.la[0] & 0xffffffff) << 3);
            }
            pSVar9 = this->_realLP;
            local_218 = 0xa00000000;
            local_248.la[0] = 0;
            local_248.ld.data = (limb_pointer)0x0;
            local_238 = 0;
            uStack_230 = 0;
            uStack_22b = 0;
            local_228 = 0;
            uStack_224 = 0;
            uStack_223 = 0;
            local_220 = 0;
            boost::multiprecision::detail::
            generic_convert_rational_to_float<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                      ((cpp_dec_float<50U,_int,_void> *)&local_248.ld,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)((long)&(this->_rationalLP->
                                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                  ).left.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.m_value.
                                  num.m_backend.
                                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                  .m_data + lVar13));
            local_268 = 0xa00000000;
            local_298.la[0] = 0;
            local_298.ld.data = (limb_pointer)0x0;
            local_288 = 0;
            uStack_280 = 0;
            uStack_27b = 0;
            local_278 = 0;
            uStack_274 = 0;
            uStack_273 = 0;
            local_270 = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_298.ld,0.0);
            (*(pSVar9->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x39])(pSVar9,(ulong)(iVar11 - 2),&local_248);
          }
          else {
            pSVar8 = this->_rationalLP;
            local_298.la[0] = 0;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor<long_long>
                      ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)&local_248.ld,(longlong *)local_298.la,(type *)0x0);
            (*(pSVar8->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
              ._vptr_ClassArray[0x36])(pSVar8,(ulong)(iVar11 - 2),&local_248,0);
            if ((local_218._5_1_ == '\0') && (local_218._6_1_ == '\0')) {
              operator_delete((void *)CONCAT35(uStack_21b,local_220),(ulong)local_228 << 3);
            }
            if ((local_238._5_1_ == '\0') && (local_238._6_1_ == '\0')) {
              operator_delete(local_248.ld.data,(local_248.la[0] & 0xffffffff) << 3);
            }
            pSVar9 = this->_realLP;
            local_218 = 0xa00000000;
            local_248.la[0] = 0;
            local_248.ld.data = (limb_pointer)0x0;
            local_238 = 0;
            uStack_230 = 0;
            uStack_22b = 0;
            local_228 = 0;
            uStack_224 = 0;
            uStack_223 = 0;
            local_220 = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_248.ld,0.0);
            (*(pSVar9->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x36])(pSVar9,(ulong)(iVar11 - 2),&local_248);
            pnVar10 = (this->_realLP->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).left.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((*(int *)((long)pIVar17 + (long)&(pnVar10->m_backend).fpclass) != 2) &&
               (dVar2 = this->_currentSettings->_realParamValues[6], !NAN(dVar2))) {
              local_218 = 0xa00000000;
              local_248.la[0] = 0;
              local_248.ld.data = (limb_pointer)0x0;
              local_238 = 0;
              uStack_230 = 0;
              uStack_22b = 0;
              local_228 = 0;
              uStack_224 = 0;
              uStack_223 = 0;
              local_220 = 0;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_248.ld,-dVar2);
              iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)((long)pIVar17 + (long)pnVar10),
                                  (cpp_dec_float<50U,_int,_void> *)&local_248.ld);
              if (0 < iVar12) {
                pSVar9 = this->_realLP;
                local_218 = 0xa00000000;
                local_248.la[0] = 0;
                local_248.ld.data = (limb_pointer)0x0;
                local_238 = 0;
                uStack_230 = 0;
                uStack_22b = 0;
                local_228 = 0;
                uStack_224 = 0;
                uStack_223 = 0;
                local_220 = 0;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)&local_248.ld,
                           -this->_currentSettings->_realParamValues[6]);
                (*(pSVar9->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._vptr_ClassArray[0x33])(pSVar9,(ulong)(iVar11 - 2),&local_248);
              }
            }
          }
        }
        else {
          RVar4 = (this->_rowTypes).data[lVar15 + -2];
          if ((RVar4 < (RANGETYPE_FIXED|RANGETYPE_LOWER)) && ((0x1aU >> (RVar4 & 0x1f) & 1) != 0)) {
            pSVar9 = this->_realLP;
            local_218 = 0xa00000000;
            local_248.la[0] = 0;
            local_248.ld.data = (limb_pointer)0x0;
            local_238 = 0;
            uStack_230 = 0;
            uStack_22b = 0;
            local_228 = 0;
            uStack_224 = 0;
            uStack_223 = 0;
            local_220 = 0;
            boost::multiprecision::detail::
            generic_convert_rational_to_float<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                      ((cpp_dec_float<50U,_int,_void> *)&local_248.ld,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)((long)&(this->_rationalLP->
                                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                  ).left.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.m_value.
                                  num.m_backend.
                                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                  .m_data + lVar13));
            (*(pSVar9->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x33])(pSVar9,(ulong)(iVar11 - 2),&local_248,0);
          }
          else {
            pnVar10 = (this->_realLP->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).left.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((*(int *)((long)pIVar17 + (long)&(pnVar10->m_backend).fpclass) != 2) &&
               (dVar2 = this->_currentSettings->_realParamValues[6], !NAN(dVar2))) {
              local_218 = 0xa00000000;
              local_248.la[0] = 0;
              local_248.ld.data = (limb_pointer)0x0;
              local_238 = 0;
              uStack_230 = 0;
              uStack_22b = 0;
              local_228 = 0;
              uStack_224 = 0;
              uStack_223 = 0;
              local_220 = 0;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_248.ld,-dVar2);
              iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)((long)pIVar17 + (long)pnVar10),
                                  (cpp_dec_float<50U,_int,_void> *)&local_248.ld);
              if (0 < iVar12) {
                pSVar9 = this->_realLP;
                local_218 = 0xa00000000;
                local_248.la[0] = 0;
                local_248.ld.data = (limb_pointer)0x0;
                local_238 = 0;
                uStack_230 = 0;
                uStack_22b = 0;
                local_228 = 0;
                uStack_224 = 0;
                uStack_223 = 0;
                local_220 = 0;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)&local_248.ld,
                           -this->_currentSettings->_realParamValues[6]);
                (*(pSVar9->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._vptr_ClassArray[0x33])(pSVar9,(ulong)(iVar11 - 2),&local_248,0);
              }
            }
          }
          if ((this->_rowTypes).data[lVar15 + -2] - RANGETYPE_UPPER < 3) {
            pSVar9 = this->_realLP;
            local_218 = 0xa00000000;
            local_248.la[0] = 0;
            local_248.ld.data = (limb_pointer)0x0;
            local_238 = 0;
            uStack_230 = 0;
            uStack_22b = 0;
            local_228 = 0;
            uStack_224 = 0;
            uStack_223 = 0;
            local_220 = 0;
            boost::multiprecision::detail::
            generic_convert_rational_to_float<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                      ((cpp_dec_float<50U,_int,_void> *)&local_248.ld,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)((long)&(this->_rationalLP->
                                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                  ).right.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.m_value.
                                  num.m_backend.
                                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                  .m_data + lVar13));
            (*(pSVar9->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x36])(pSVar9,(ulong)(iVar11 - 2),&local_248);
          }
          else {
            pnVar10 = (this->_realLP->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).right.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((*(int *)((long)pIVar17 + (long)&(pnVar10->m_backend).fpclass) != 2) &&
               (dVar2 = this->_currentSettings->_realParamValues[6], !NAN(dVar2))) {
              local_218 = 0xa00000000;
              local_248.la[0] = 0;
              local_248.ld.data = (limb_pointer)0x0;
              local_238 = 0;
              uStack_230 = 0;
              uStack_22b = 0;
              local_228 = 0;
              uStack_224 = 0;
              uStack_223 = 0;
              local_220 = 0;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_248.ld,dVar2);
              iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)((long)pIVar17 + (long)pnVar10),
                                  (cpp_dec_float<50U,_int,_void> *)&local_248.ld);
              if (iVar12 < 0) {
                pSVar9 = this->_realLP;
                local_218 = 0xa00000000;
                local_248.la[0] = 0;
                local_248.ld.data = (limb_pointer)0x0;
                local_238 = 0;
                uStack_230 = 0;
                uStack_22b = 0;
                local_228 = 0;
                uStack_224 = 0;
                uStack_223 = 0;
                local_220 = 0;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)&local_248.ld,
                           this->_currentSettings->_realParamValues[6]);
                (*(pSVar9->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._vptr_ClassArray[0x36])(pSVar9,(ulong)(iVar11 - 2),&local_248);
              }
            }
          }
        }
      }
      else {
        DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::add(&this->_tauColVector,iVar11 + -2,
              (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)((long)&(this->_rationalLP->
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                         ).left.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.m_value.num.
                         m_backend.
                         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                         .m_data + lVar13));
        pSVar8 = this->_rationalLP;
        if ((this->_rowTypes).data[lVar15 + -2] - RANGETYPE_UPPER < 3) {
          local_298.la[0] = 0;
          local_250 = pIVar17;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&local_248.ld,(longlong *)local_298.la,(type *)0x0);
          local_d8.la[0] =
               (long)&(this->_rationalLP->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      ).right.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.m_value.num.m_backend.
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      .m_data + lVar13;
          local_d8.ld.data =
               (limb_pointer)
               ((long)&(this->_rationalLP->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       ).left.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.m_value.num.m_backend
                       .
                       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                       .m_data + lVar13);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
          ::
          number<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>
                    ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                      *)&local_298.ld,
                     (expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                      *)&local_d8.ld,(type *)0x0);
          (*(pSVar8->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
            ._vptr_ClassArray[0x39])(pSVar8,(ulong)(iVar11 - 2),&local_248,&local_298);
          if ((local_268._5_1_ == '\0') && (local_268._6_1_ == '\0')) {
            operator_delete((void *)CONCAT35(uStack_26b,local_270),(ulong)local_278 << 3);
          }
          if ((local_288._5_1_ == '\0') && (local_288._6_1_ == '\0')) {
            operator_delete(local_298.ld.data,(local_298.la[0] & 0xffffffff) << 3);
          }
          if ((local_218._5_1_ == '\0') && (local_218._6_1_ == '\0')) {
            operator_delete((void *)CONCAT35(uStack_21b,local_220),(ulong)local_228 << 3);
          }
          if ((local_238._5_1_ == '\0') && (local_238._6_1_ == '\0')) {
            operator_delete(local_248.ld.data,(local_248.la[0] & 0xffffffff) << 3);
          }
          pSVar9 = this->_realLP;
          local_218 = 0xa00000000;
          local_248.la[0] = 0;
          local_248.ld.data = (limb_pointer)0x0;
          local_238 = 0;
          uStack_230 = 0;
          uStack_22b = 0;
          local_228 = 0;
          uStack_224 = 0;
          uStack_223 = 0;
          local_220 = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_248.ld,0.0);
          local_268 = 0xa00000000;
          local_298.la[0] = 0;
          local_298.ld.data = (limb_pointer)0x0;
          local_288 = 0;
          uStack_280 = 0;
          uStack_27b = 0;
          local_278 = 0;
          uStack_274 = 0;
          uStack_273 = 0;
          local_270 = 0;
          boost::multiprecision::detail::
          generic_convert_rational_to_float<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                    ((cpp_dec_float<50U,_int,_void> *)&local_298.ld,
                     (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)((long)&(this->_rationalLP->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                ).right.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.m_value.num.
                                m_backend.
                                super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                .m_data + lVar13));
          (*(pSVar9->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x39])(pSVar9,(ulong)(iVar11 - 2),&local_248);
          pIVar17 = local_250;
        }
        else {
          local_298.la[0] = 0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&local_248.ld,(longlong *)local_298.la,(type *)0x0);
          (*(pSVar8->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
            ._vptr_ClassArray[0x33])(pSVar8,(ulong)(iVar11 - 2),&local_248);
          if ((local_218._5_1_ == '\0') && (local_218._6_1_ == '\0')) {
            operator_delete((void *)CONCAT35(uStack_21b,local_220),(ulong)local_228 << 3);
          }
          if ((local_238._5_1_ == '\0') && (local_238._6_1_ == '\0')) {
            operator_delete(local_248.ld.data,(local_248.la[0] & 0xffffffff) << 3);
          }
          pSVar9 = this->_realLP;
          local_218 = 0xa00000000;
          local_248.la[0] = 0;
          local_248.ld.data = (limb_pointer)0x0;
          local_238 = 0;
          uStack_230 = 0;
          uStack_22b = 0;
          local_228 = 0;
          uStack_224 = 0;
          uStack_223 = 0;
          local_220 = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_248.ld,0.0);
          (*(pSVar9->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x33])(pSVar9,(ulong)(iVar11 - 2),&local_248);
          pnVar10 = (this->_realLP->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).right.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((*(int *)((long)pIVar17 + (long)&(pnVar10->m_backend).fpclass) != 2) &&
             (dVar2 = this->_currentSettings->_realParamValues[6], !NAN(dVar2))) {
            local_218 = 0xa00000000;
            local_248.la[0] = 0;
            local_248.ld.data = (limb_pointer)0x0;
            local_238 = 0;
            uStack_230 = 0;
            uStack_22b = 0;
            local_228 = 0;
            uStack_224 = 0;
            uStack_223 = 0;
            local_220 = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_248.ld,dVar2);
            iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)((long)pIVar17 + (long)pnVar10),
                                (cpp_dec_float<50U,_int,_void> *)&local_248.ld);
            if (iVar12 < 0) {
              pSVar9 = this->_realLP;
              local_218 = 0xa00000000;
              local_248.la[0] = 0;
              local_248.ld.data = (limb_pointer)0x0;
              local_238 = 0;
              uStack_230 = 0;
              uStack_22b = 0;
              local_228 = 0;
              uStack_224 = 0;
              uStack_223 = 0;
              local_220 = 0;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_248.ld,
                         this->_currentSettings->_realParamValues[6]);
              (*(pSVar9->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x36])(pSVar9,(ulong)(iVar11 - 2),&local_248);
            }
          }
        }
      }
      lVar15 = lVar15 + -1;
      lVar13 = lVar13 + -0x40;
    } while (1 < lVar15);
  }
  if (((this->_tauColVector).
       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
       .memused == 0) && (VVar3 = (this->spxout).m_verbosity, 4 < (int)VVar3)) {
    (this->spxout).m_verbosity = INFO3;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[5],"LP is trivially feasible.\n",0x1a);
    (this->spxout).m_verbosity = VVar3;
  }
  local_98 = 0xffffffff00000000;
  local_298.la[0] = 0xffffffffffffffff;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>
            ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              *)&local_248.ld,(longlong *)local_298.la,(type *)0x0);
  p_vector = &(this->_tauColVector).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ;
  iVar12 = (this->_tauColVector).
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           .memused;
  if (iVar12 != 0) {
    pNVar18 = p_vector->m_elem;
    do {
      boost::
      rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator*=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)pNVar18,
                   (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)&local_248.ld);
      pNVar18 = pNVar18 + 1;
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
  }
  if ((local_218._5_1_ == '\0') && (local_218._6_1_ == '\0')) {
    operator_delete((void *)CONCAT35(uStack_21b,local_220),(ulong)local_228 << 3);
  }
  if ((local_238._5_1_ == '\0') && (local_238._6_1_ == '\0')) {
    operator_delete(local_248.ld.data,(local_248.la[0] & 0xffffffff) << 3);
  }
  iVar12 = this->_currentSettings->_intParamValues[0];
  pSVar8 = this->_rationalLP;
  local_d8.la[0] = 1;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>
            ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              *)&local_298.ld,(longlong *)local_d8.la,(type *)0x0);
  local_68.m_backend.data._M_elems[0] = 0;
  local_68.m_backend.data._M_elems[1] = 0;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>
            ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              *)&local_d8.ld,(longlong *)&local_68,(type *)0x0);
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::LPColBase((LPColBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               *)&local_248.ld,
              (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)&(&this->_rationalPosone)[iVar12 != 1].m_backend,p_vector,
              (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)&local_298.ld,
              (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)&local_d8.ld);
  (*(pSVar8->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
    ._vptr_ClassArray[0xc])(pSVar8,&local_98,&local_248,0);
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::~LPColBase((LPColBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)&local_248.ld);
  if ((local_a8._5_1_ == '\0') && (local_a8._6_1_ == '\0')) {
    operator_delete((void *)CONCAT35(uStack_ab,local_b0),(ulong)local_b8 << 3);
  }
  if ((local_c8._5_1_ == '\0') && (local_c8._6_1_ == '\0')) {
    operator_delete(local_d8.ld.data,(local_d8.la[0] & 0xffffffff) << 3);
  }
  if ((local_268._5_1_ == '\0') && (local_268._6_1_ == '\0')) {
    operator_delete((void *)CONCAT35(uStack_26b,local_270),(ulong)local_278 << 3);
  }
  if ((local_288._5_1_ == '\0') && (local_288._6_1_ == '\0')) {
    operator_delete(local_298.ld.data,(local_298.la[0] & 0xffffffff) << 3);
  }
  pSVar9 = this->_realLP;
  local_268 = 0xa00000000;
  local_298.la[0] = 0;
  local_298.ld.data = (limb_pointer)0x0;
  local_288 = 0;
  uStack_280 = 0;
  uStack_27b = 0;
  local_278 = 0;
  uStack_274 = 0;
  uStack_273 = 0;
  local_270 = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_298.ld,
             *(double *)
              (&DAT_00601190 + (ulong)(this->_currentSettings->_intParamValues[0] == 1) * 8));
  local_88.
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  local_88.
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  local_88.
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  local_88._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006adc40;
  local_88.theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&local_88,
             (this->_tauColVector).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             .memused);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator=((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               *)&local_88.
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,p_vector);
  local_a8 = 0xa00000000;
  local_d8.la[0] = 0;
  local_d8.ld.data = (limb_pointer)0x0;
  local_c8 = 0;
  uStack_c0 = 0;
  uStack_bb = 0;
  local_b8 = 0;
  uStack_b4 = 0;
  uStack_b3 = 0;
  local_b0 = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_d8.ld,1.0);
  local_68.m_backend.fpclass = cpp_dec_float_finite;
  local_68.m_backend.prec_elem = 10;
  local_68.m_backend.data._M_elems[0] = 0;
  local_68.m_backend.data._M_elems[1] = 0;
  local_68.m_backend.data._M_elems[2] = 0;
  local_68.m_backend.data._M_elems[3] = 0;
  local_68.m_backend.data._M_elems[4] = 0;
  local_68.m_backend.data._M_elems[5] = 0;
  local_68.m_backend.data._M_elems._24_5_ = 0;
  local_68.m_backend.data._M_elems[7]._1_3_ = 0;
  local_68.m_backend.data._M_elems._32_5_ = 0;
  local_68.m_backend._37_8_ = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_68,0.0);
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::LPColBase((LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)&local_248.ld,
              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_298.ld,
              &local_88.
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_d8.ld,&local_68);
  (*(pSVar9->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0xc])(pSVar9,&local_98,&local_248,0);
  local_1a0 = &PTR__DSVectorBase_006adc40;
  if (local_188 != (void *)0x0) {
    free(local_188);
    local_188 = (void *)0x0;
  }
  local_88._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006adc40;
  if (local_88.theelem !=
      (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0) {
    free(local_88.theelem);
    local_88.theelem =
         (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
  }
  uVar5 = (this->_colTypes).thesize;
  ctx = (EVP_PKEY_CTX *)(ulong)uVar5;
  DataArray<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::RangeType>
  ::insert(&this->_colTypes,uVar5,1);
  (this->_colTypes).data[(int)uVar5] = RANGETYPE_BOXED;
  if (this->_hasBasis == true) {
    uVar5 = (this->_basisStatusCols).thesize;
    ctx = (EVP_PKEY_CTX *)(ulong)uVar5;
    DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
    ::insert(&this->_basisStatusCols,uVar5,1);
    (this->_basisStatusCols).data[(int)uVar5] = ON_UPPER;
  }
  if ((this->_rationalLUSolver).super_CLUFactorRational.stat != UNLOADED) {
    SLUFactorRational::init(&this->_rationalLUSolver,ctx);
  }
  (*this->_statistics->transformTime->_vptr_Timer[4])();
  if ((local_e4._1_1_ == '\0') && (local_e2 == '\0')) {
    operator_delete(local_f8.ld.data,(local_f8.la[0] & 0xffffffff) << 3);
  }
  if ((local_104._1_1_ == '\0') && (local_102 == '\0')) {
    operator_delete(local_118.ld.data,(local_118.la[0] & 0xffffffff) << 3);
  }
  if ((local_134._1_1_ == '\0') && (local_132 == '\0')) {
    operator_delete(local_148.ld.data,(local_148.la[0] & 0xffffffff) << 3);
  }
  if ((local_154._1_1_ == '\0') && (local_152 == '\0')) {
    operator_delete(local_168.ld.data,(local_168.la[0] & 0xffffffff) << 3);
  }
  return;
}

Assistant:

void SoPlexBase<R>::_transformFeasibility()
{
   SPX_MSG_INFO1(spxout, spxout << "Setting up LP to test for feasibility.\n");

   // start timing
   _statistics->transformTime->start();

   // print LP if in debug mode
   SPX_DEBUG(_realLP->writeFileLPBase("beforeTransFeas.lp", 0, 0, 0));

   // store objective function
   _feasObj.reDim(numColsRational());

   for(int c = numColsRational() - 1; c >= 0; c--)
      _feasObj[c] = _rationalLP->maxObj(c);

   // store bounds
   _feasLower.reDim(numColsRational());
   _feasUpper.reDim(numColsRational());

   for(int c = numColsRational() - 1; c >= 0; c--)
   {
      if(_lowerFinite(_colTypes[c]))
         _feasLower[c] = lowerRational(c);

      if(_upperFinite(_colTypes[c]))
         _feasUpper[c] = upperRational(c);
   }

   // store sides
   _feasLhs.reDim(numRowsRational());
   _feasRhs.reDim(numRowsRational());

   for(int r = numRowsRational() - 1; r >= 0; r--)
   {
      if(_lowerFinite(_rowTypes[r]))
         _feasLhs[r] = lhsRational(r);

      if(_upperFinite(_rowTypes[r]))
         _feasRhs[r] = rhsRational(r);
   }

   // set objective coefficients to zero; shift primal space such as to guarantee that the zero solution is within
   // the bounds
   Rational shiftValue;
   Rational shiftValue2;

   for(int c = numColsRational() - 1; c >= 0; c--)
   {
      _rationalLP->changeMaxObj(c, Rational(0));
      _realLP->changeMaxObj(c, R(0.0));

      if(lowerRational(c) > 0)
      {
         const SVectorRational& colVector = colVectorRational(c);

         for(int i = 0; i < colVector.size(); i++)
         {
            shiftValue = colVector.value(i);
            shiftValue *= lowerRational(c);
            int r = colVector.index(i);

            assert((lhsRational(r) > _rationalNegInfty) == _lowerFinite(_rowTypes[r]));
            assert((rhsRational(r) < _rationalPosInfty) == _upperFinite(_rowTypes[r]));

            if(_lowerFinite(_rowTypes[r]) && _upperFinite(_rowTypes[r]))
            {
               shiftValue2 = lhsRational(r);
               shiftValue2 -= shiftValue;
               _rationalLP->changeLhs(r, shiftValue2);
               _realLP->changeLhs(r, R(shiftValue2));

               shiftValue -= rhsRational(r);
               shiftValue *= -1;
               _rationalLP->changeRhs(r, shiftValue);
               _realLP->changeRhs(r, R(shiftValue));
            }
            else if(_lowerFinite(_rowTypes[r]))
            {
               shiftValue -= lhsRational(r);
               shiftValue *= -1;
               _rationalLP->changeLhs(r, shiftValue);
               _realLP->changeLhs(r, R(shiftValue));
            }
            else if(_upperFinite(_rowTypes[r]))
            {
               shiftValue -= rhsRational(r);
               shiftValue *= -1;
               _rationalLP->changeRhs(r, shiftValue);
               _realLP->changeRhs(r, R(shiftValue));
            }
         }

         assert((upperRational(c) < _rationalPosInfty) == _upperFinite(_colTypes[c]));

         if(_upperFinite(_colTypes[c]))
         {
            _rationalLP->changeBounds(c, 0, upperRational(c) - lowerRational(c));
            _realLP->changeBounds(c, 0.0, R(upperRational(c)));
         }
         else if(_realLP->upper(c) < realParam(SoPlexBase<R>::INFTY))
         {
            _rationalLP->changeLower(c, Rational(0));
            _realLP->changeBounds(c, 0.0, realParam(SoPlexBase<R>::INFTY));
         }
         else
         {
            _rationalLP->changeLower(c, Rational(0));
            _realLP->changeLower(c, R(0.0));
         }
      }
      else if(upperRational(c) < 0)
      {
         const SVectorRational& colVector = colVectorRational(c);

         for(int i = 0; i < colVector.size(); i++)
         {
            shiftValue = colVector.value(i);
            shiftValue *= upperRational(c);
            int r = colVector.index(i);

            assert((lhsRational(r) > _rationalNegInfty) == _lowerFinite(_rowTypes[r]));
            assert((rhsRational(r) < _rationalPosInfty) == _upperFinite(_rowTypes[r]));

            if(_lowerFinite(_rowTypes[r]) && _upperFinite(_rowTypes[r]))
            {
               shiftValue2 = lhsRational(r);
               shiftValue2 -= shiftValue;
               _rationalLP->changeLhs(r, shiftValue2);
               _realLP->changeLhs(r, R(shiftValue2));

               shiftValue -= rhsRational(r);
               shiftValue *= -1;
               _rationalLP->changeRhs(r, shiftValue);
               _realLP->changeRhs(r, R(shiftValue));
            }
            else if(_lowerFinite(_rowTypes[r]))
            {
               shiftValue -= lhsRational(r);
               shiftValue *= -1;
               _rationalLP->changeLhs(r, shiftValue);
               _realLP->changeLhs(r, R(shiftValue));
            }
            else if(_upperFinite(_rowTypes[r]))
            {
               shiftValue -= rhsRational(r);
               shiftValue *= -1;
               _rationalLP->changeRhs(r, shiftValue);
               _realLP->changeRhs(r, R(shiftValue));
            }
         }

         assert((lowerRational(c) > _rationalNegInfty) == _lowerFinite(_colTypes[c]));

         if(_lowerFinite(_colTypes[c]))
         {
            _rationalLP->changeBounds(c, lowerRational(c) - upperRational(c), 0);
            _realLP->changeBounds(c, R(lowerRational(c)), 0.0);
         }
         else if(_realLP->lower(c) > -realParam(SoPlexBase<R>::INFTY))
         {
            _rationalLP->changeUpper(c, Rational(0));
            _realLP->changeBounds(c, -realParam(SoPlexBase<R>::INFTY), 0.0);
         }
         else
         {
            _rationalLP->changeUpper(c, Rational(0));
            _realLP->changeUpper(c, R(0.0));
         }
      }
      else
      {
         if(_lowerFinite(_colTypes[c]))
            _realLP->changeLower(c, R(lowerRational(c)));
         else if(_realLP->lower(c) > -realParam(SoPlexBase<R>::INFTY))
            _realLP->changeLower(c, -realParam(SoPlexBase<R>::INFTY));

         if(_upperFinite(_colTypes[c]))
            _realLP->changeUpper(c, R(upperRational(c)));
         else if(_realLP->upper(c) < realParam(SoPlexBase<R>::INFTY))
            _realLP->changeUpper(c, realParam(SoPlexBase<R>::INFTY));
      }

      assert(lowerReal(c) <= upperReal(c));
   }

   // homogenize sides
   _tauColVector.clear();

   for(int r = numRowsRational() - 1; r >= 0; r--)
   {
      if(lhsRational(r) > 0)
      {
         _tauColVector.add(r, lhsRational(r));
         assert((rhsRational(r) < _rationalPosInfty) == _upperFinite(_rowTypes[r]));

         if(_upperFinite(_rowTypes[r]))
         {
            _rationalLP->changeRange(r, 0, rhsRational(r) - lhsRational(r));
            _realLP->changeRange(r, 0.0, R(rhsRational(r)));
         }
         else
         {
            _rationalLP->changeLhs(r, Rational(0));
            _realLP->changeLhs(r, R(0.0));

            if(_realLP->rhs(r) < realParam(SoPlexBase<R>::INFTY))
               _realLP->changeRhs(r, realParam(SoPlexBase<R>::INFTY));
         }
      }
      else if(rhsRational(r) < 0)
      {
         _tauColVector.add(r, rhsRational(r));
         assert((lhsRational(r) > _rationalNegInfty) == _lowerFinite(_rowTypes[r]));

         if(_lowerFinite(_rowTypes[r]))
         {
            _rationalLP->changeRange(r, lhsRational(r) - rhsRational(r), 0);
            _realLP->changeRange(r, R(lhsRational(r)), 0.0);
         }
         else
         {
            _rationalLP->changeRhs(r, Rational(0));
            _realLP->changeRhs(r, R(0.0));

            if(_realLP->lhs(r) > -realParam(SoPlexBase<R>::INFTY))
               _realLP->changeLhs(r, -realParam(SoPlexBase<R>::INFTY));
         }
      }
      else
      {
         if(_lowerFinite(_rowTypes[r]))
            _realLP->changeLhs(r, R(lhsRational(r)));
         else if(_realLP->lhs(r) > -realParam(SoPlexBase<R>::INFTY))
            _realLP->changeLhs(r, -realParam(SoPlexBase<R>::INFTY));

         if(_upperFinite(_rowTypes[r]))
            _realLP->changeRhs(r, R(rhsRational(r)));
         else if(_realLP->rhs(r) < realParam(SoPlexBase<R>::INFTY))
            _realLP->changeRhs(r, realParam(SoPlexBase<R>::INFTY));
      }

      assert(rhsReal(r) <= rhsReal(r));
   }

   ///@todo exploit this case by returning without LP solving
   if(_tauColVector.size() == 0)
   {
      SPX_MSG_INFO3(spxout, spxout << "LP is trivially feasible.\n");
   }

   // add artificial column
   SPxColId id;
   _tauColVector *= -1;
   _rationalLP->addCol(id,
                       LPColRational((intParam(SoPlexBase<R>::OBJSENSE) == SoPlexBase<R>::OBJSENSE_MAXIMIZE ?
                                      _rationalPosone : _rationalNegone),
                                     _tauColVector, 1, 0));
   _realLP->addCol(id,
                   LPColBase<R>((intParam(SoPlexBase<R>::OBJSENSE) == SoPlexBase<R>::OBJSENSE_MAXIMIZE ? 1.0 : -1.0),
                                DSVectorBase<R>(_tauColVector), 1.0, 0.0));
   _colTypes.append(RANGETYPE_BOXED);

   // adjust basis
   if(_hasBasis)
   {
      _basisStatusCols.append(SPxSolverBase<R>::ON_UPPER);
   }

   // invalidate rational basis factorization
   _rationalLUSolver.clear();

   // print LP if in debug mode
   SPX_DEBUG(_realLP->writeFileLPBase("afterTransFeas.lp", 0, 0, 0));

   // stop timing
   _statistics->transformTime->stop();
}